

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O0

void duckdb::IntervalConversionUs
               (Vector *vector,ArrowArray *array,ArrowScanLocalState *scan_state,
               int64_t nested_offset,int64_t parent_offset,idx_t size,int64_t conversion)

{
  bool bVar1;
  ArrowArray *array_00;
  idx_t iVar2;
  string *msg;
  ArrowArray *in_RSI;
  ulong in_R9;
  int64_t in_stack_00000008;
  idx_t row;
  long *src_ptr;
  interval_t *tgt_ptr;
  ArrowScanLocalState *in_stack_ffffffffffffff68;
  int64_t in_stack_ffffffffffffff70;
  allocator *this;
  allocator local_69;
  string local_68 [32];
  ulong local_48;
  int64_t *local_40;
  interval_t *local_38;
  ulong local_30;
  ArrowArray *local_10;
  
  local_30 = in_R9;
  local_10 = in_RSI;
  local_38 = FlatVector::GetData<duckdb::interval_t>((Vector *)0x149fa63);
  array_00 = (ArrowArray *)ArrowBufferData<long>(local_10,1);
  iVar2 = GetEffectiveOffset(array_00,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x149fa9e)
  ;
  local_40 = &array_00->length + iVar2;
  local_48 = 0;
  while( true ) {
    if (local_30 <= local_48) {
      return;
    }
    local_38[local_48].days = 0;
    local_38[local_48].months = 0;
    bVar1 = TryMultiplyOperator::Operation<long,long,long>
                      (local_40[local_48],in_stack_00000008,&local_38[local_48].micros);
    if (!bVar1) break;
    local_48 = local_48 + 1;
  }
  msg = (string *)__cxa_allocate_exception(0x10);
  this = &local_69;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_68,"Could not convert Interval to Microsecond",this);
  ConversionException::ConversionException((ConversionException *)this,msg);
  __cxa_throw(msg,&ConversionException::typeinfo,ConversionException::~ConversionException);
}

Assistant:

static void IntervalConversionUs(Vector &vector, ArrowArray &array, const ArrowScanLocalState &scan_state,
                                 int64_t nested_offset, int64_t parent_offset, idx_t size, int64_t conversion) {
	auto tgt_ptr = FlatVector::GetData<interval_t>(vector);
	auto src_ptr =
	    ArrowBufferData<int64_t>(array, 1) + GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	for (idx_t row = 0; row < size; row++) {
		tgt_ptr[row].days = 0;
		tgt_ptr[row].months = 0;
		if (!TryMultiplyOperator::Operation(src_ptr[row], conversion, tgt_ptr[row].micros)) {
			throw ConversionException("Could not convert Interval to Microsecond");
		}
	}
}